

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

int __thiscall
cxxopts::values::standard_value<unsigned_int>::clone
          (standard_value<unsigned_int> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg
          ,...)

{
  shared_ptr<cxxopts::values::standard_value<unsigned_int>_> *in_stack_ffffffffffffffc8;
  standard_value<unsigned_int> *this_00;
  
  this_00 = this;
  std::
  make_shared<cxxopts::values::standard_value<unsigned_int>,cxxopts::values::standard_value<unsigned_int>const&>
            (this);
  std::shared_ptr<cxxopts::Value>::shared_ptr<cxxopts::values::standard_value<unsigned_int>,void>
            ((shared_ptr<cxxopts::Value> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<cxxopts::values::standard_value<unsigned_int>_>::~shared_ptr
            ((shared_ptr<cxxopts::values::standard_value<unsigned_int>_> *)0x177c73);
  return (int)this;
}

Assistant:

const override
      {
        return std::make_shared<standard_value<T>>(*this);
      }